

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O2

void BrotliWriteHuffmanTree
               (uint8_t *depth,size_t length,size_t *tree_size,uint8_t *tree,
               uint8_t *extra_bits_data)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  size_t start;
  ulong uVar8;
  ulong uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  sVar7 = length;
  do {
    uVar5 = sVar7;
    if (uVar5 == 0) {
      uVar5 = 0;
      break;
    }
    sVar7 = uVar5 - 1;
  } while (depth[uVar5 - 1] == '\0');
  if (length < 0x33) {
    bVar14 = false;
    bVar1 = false;
  }
  else {
    lVar2 = 1;
    uVar3 = 0;
    uVar4 = 0;
    lVar6 = lVar2;
    for (uVar8 = 0; uVar8 <= uVar5 && uVar5 - uVar8 != 0; uVar8 = uVar8 + uVar9) {
      for (uVar12 = 1;
          (uVar9 = uVar5 - uVar8, uVar8 + uVar12 < uVar5 &&
          (uVar9 = uVar12, depth[uVar12 + uVar8] == depth[uVar8])); uVar12 = uVar12 + 1) {
      }
      bVar14 = depth[uVar8] == '\0';
      lVar2 = lVar2 + (ulong)(bVar14 && 2 < uVar9);
      uVar12 = 0;
      if (bVar14 && 2 < uVar9) {
        uVar12 = uVar9;
      }
      uVar4 = uVar4 + uVar12;
      uVar12 = 0;
      if (3 < uVar9 && !bVar14) {
        uVar12 = uVar9;
      }
      uVar3 = uVar3 + uVar12;
      lVar6 = lVar6 + (ulong)(3 < uVar9 && !bVar14);
    }
    bVar14 = (ulong)(lVar6 * 2) < uVar3;
    bVar1 = (ulong)(lVar2 * 2) < uVar4;
  }
  uVar11 = '\b';
  uVar3 = 0;
  do {
    if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
      return;
    }
    uVar10 = depth[uVar3];
    if (((bool)(bVar14 & uVar10 != '\0')) || ((bool)(uVar10 == '\0' & bVar1))) {
      for (uVar4 = 1;
          (uVar8 = uVar5 - uVar3, uVar3 + uVar4 < uVar5 &&
          (uVar8 = uVar4, depth[uVar4 + uVar3] == uVar10)); uVar4 = uVar4 + 1) {
      }
      if (uVar10 != '\0') goto LAB_0012f25d;
      if (uVar8 == 0xb) {
        tree[*tree_size] = '\0';
        extra_bits_data[*tree_size] = '\0';
        sVar7 = *tree_size + 1;
        *tree_size = sVar7;
        uVar8 = 0xb;
        uVar4 = 7;
        start = sVar7;
      }
      else {
        uVar4 = uVar8;
        if (uVar8 < 3) goto LAB_0012f21d;
        sVar7 = *tree_size;
        uVar4 = uVar8 - 3;
        start = sVar7;
      }
      while( true ) {
        tree[sVar7] = '\x11';
        extra_bits_data[*tree_size] = (byte)uVar4 & 7;
        sVar7 = *tree_size + 1;
        *tree_size = sVar7;
        uVar10 = uVar11;
        if (uVar4 < 8) break;
        uVar4 = (uVar4 >> 3) - 1;
      }
LAB_0012f37a:
      Reverse(tree,start,sVar7);
      Reverse(extra_bits_data,start,*tree_size);
      uVar4 = uVar8;
      uVar11 = uVar10;
    }
    else {
      uVar8 = 1;
      uVar4 = uVar8;
      if (uVar10 != '\0') {
LAB_0012f25d:
        uVar12 = uVar8;
        if (uVar11 != uVar10) {
          tree[*tree_size] = uVar10;
          extra_bits_data[*tree_size] = '\0';
          *tree_size = *tree_size + 1;
          uVar12 = uVar8 - 1;
        }
        if (uVar12 == 7) {
          tree[*tree_size] = uVar10;
          extra_bits_data[*tree_size] = '\0';
          sVar7 = *tree_size + 1;
          *tree_size = sVar7;
          uVar12 = 3;
          start = sVar7;
        }
        else {
          if (uVar12 < 3) {
            while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, uVar4 = uVar8, uVar11 = uVar10, bVar13
                  ) {
              tree[*tree_size] = uVar10;
              extra_bits_data[*tree_size] = '\0';
              *tree_size = *tree_size + 1;
            }
            goto LAB_0012f39b;
          }
          sVar7 = *tree_size;
          uVar12 = uVar12 - 3;
          start = sVar7;
        }
        while( true ) {
          tree[sVar7] = '\x10';
          extra_bits_data[*tree_size] = (byte)uVar12 & 3;
          sVar7 = *tree_size + 1;
          *tree_size = sVar7;
          if (uVar12 < 4) break;
          uVar12 = (uVar12 >> 2) - 1;
        }
        goto LAB_0012f37a;
      }
LAB_0012f21d:
      while (bVar13 = uVar8 != 0, uVar8 = uVar8 - 1, bVar13) {
        tree[*tree_size] = '\0';
        extra_bits_data[*tree_size] = '\0';
        *tree_size = *tree_size + 1;
      }
    }
LAB_0012f39b:
    uVar3 = uVar3 + uVar4;
  } while( true );
}

Assistant:

void BrotliWriteHuffmanTree(const uint8_t* depth,
                            size_t length,
                            size_t* tree_size,
                            uint8_t* tree,
                            uint8_t* extra_bits_data) {
  uint8_t previous_value = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
  size_t i;
  BROTLI_BOOL use_rle_for_non_zero = BROTLI_FALSE;
  BROTLI_BOOL use_rle_for_zero = BROTLI_FALSE;

  /* Throw away trailing zeros. */
  size_t new_length = length;
  for (i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  /* First gather statistics on if it is a good idea to do RLE. */
  if (length > 50) {
    /* Find RLE coding for longer codes.
       Shorter codes seem not to benefit from RLE. */
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  /* Actual RLE coding. */
  for (i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      size_t k;
      for (k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      BrotliWriteHuffmanTreeRepetitionsZeros(
          reps, tree_size, tree, extra_bits_data);
    } else {
      BrotliWriteHuffmanTreeRepetitions(previous_value,
                                        value, reps, tree_size,
                                        tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}